

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O1

int __thiscall
QDateTimeEditPrivate::nextPrevSection(QDateTimeEditPrivate *this,int current,bool forward)

{
  LayoutDirection LVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  
  LVar1 = QWidget::layoutDirection
                    (*(QWidget **)
                      &(this->super_QAbstractSpinBoxPrivate).super_QWidgetPrivate.field_0x8);
  bVar3 = (LVar1 == RightToLeft) != forward;
  if (current == -3) {
    iVar2 = -3;
    if (!bVar3) {
      iVar2 = *(int *)&this->field_0x418 + -1;
    }
  }
  else if (current == -1) {
    iVar2 = -2;
  }
  else if (current == -2) {
    iVar2 = (uint)bVar3 * 2 + -2;
  }
  else {
    iVar4 = (bVar3 - 1 | 1) + current;
    iVar2 = -3;
    if (((long)iVar4 < *(long *)&this->field_0x418) && (iVar2 = -2, -1 < iVar4)) {
      iVar2 = iVar4;
    }
  }
  return iVar2;
}

Assistant:

int QDateTimeEditPrivate::nextPrevSection(int current, bool forward) const
{
    Q_Q(const QDateTimeEdit);
    if (q->isRightToLeft())
        forward = !forward;

    switch (current) {
    case FirstSectionIndex: return forward ? 0 : FirstSectionIndex;
    case LastSectionIndex: return (forward ? LastSectionIndex : int(sectionNodes.size() - 1));
    case NoSectionIndex: return FirstSectionIndex;
    default: break;
    }
    Q_ASSERT(current >= 0 && current < sectionNodes.size());

    current += (forward ? 1 : -1);
    if (current >= sectionNodes.size()) {
        return LastSectionIndex;
    } else if (current < 0) {
        return FirstSectionIndex;
    }

    return current;
}